

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O2

Character * __thiscall World::GetCharacter(World *this,string *name)

{
  pointer ppCVar1;
  Character *pCVar2;
  __type _Var3;
  pointer ppCVar4;
  string local_50;
  
  util::lowercase(&local_50,name);
  std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  ppCVar4 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  do {
    if (ppCVar4 == ppCVar1) {
      return (Character *)0x0;
    }
    pCVar2 = *ppCVar4;
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_50,pCVar2);
    _Var3 = std::operator==(&local_50,name);
    std::__cxx11::string::~string((string *)&local_50);
    ppCVar4 = ppCVar4 + 1;
  } while (!_Var3);
  return pCVar2;
}

Assistant:

Character *World::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName() == name)
		{
			return character;
		}
	}

	return 0;
}